

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O3

void chatra::emb::io::fileInputStream_seek(Ct *ct)

{
  IFile *pIVar1;
  int iVar2;
  FileInputStreamData *pFVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 extraout_var_00;
  uint uVar5;
  
  pFVar3 = derefSelfAsInput(ct);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pFVar3->mt);
  if (iVar2 == 0) {
    pIVar1 = (pFVar3->file)._M_t.
             super___uniq_ptr_impl<chatra::IFile,_std::default_delete<chatra::IFile>_>._M_t.
             super__Tuple_impl<0UL,_chatra::IFile_*,_std::default_delete<chatra::IFile>_>.
             super__Head_base<0UL,_chatra::IFile_*,_false>._M_head_impl;
    iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,0);
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
                      ((long *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,1);
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    uVar5 = (iVar2 != 1) + 1;
    if (iVar2 == 0) {
      uVar5 = 0;
    }
    (*pIVar1->_vptr_IFile[6])(pIVar1,uVar4,(ulong)uVar5);
    pthread_mutex_unlock((pthread_mutex_t *)&pFVar3->mt);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

static void fileInputStream_seek(Ct& ct) {
	auto* self = derefSelfAsInput(ct);
	std::lock_guard<std::mutex> lock(self->mt);
	self->file->seek(ct.at(0).get<ptrdiff_t>(), parseOrigin(ct, 1));
}